

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::ArenaTest_AllConstructibleAndDestructibleCombinationsWorkCorrectly_Test::
~ArenaTest_AllConstructibleAndDestructibleCombinationsWorkCorrectly_Test
          (ArenaTest_AllConstructibleAndDestructibleCombinationsWorkCorrectly_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaTest, AllConstructibleAndDestructibleCombinationsWorkCorrectly) {
  TestCtorAndDtorTraits<false, false>({"()", "~()"}, {"(const T&)", "~()"},
                                      {"(int)", "~()"});
  // If the object is not arena constructible, then the destructor is always
  // called even if marked as skippable.
  TestCtorAndDtorTraits<false, true>({"()", "~()"}, {"(const T&)", "~()"},
                                     {"(int)", "~()"});

  // Some types are arena constructible but we can't skip the destructor. Those
  // are constructed with an arena but still destroyed.
  TestCtorAndDtorTraits<true, false>({"(Arena)", "~()"},
                                     {"(Arena, const T&)", "~()"},
                                     {"(Arena, int)", "~()"});
  TestCtorAndDtorTraits<true, true>({"(Arena)"}, {"(Arena, const T&)"},
                                    {"(Arena, int)"});
}